

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void __thiscall CodeGenGenericContext::LockXmmReg(CodeGenGenericContext *this,x86XmmReg reg)

{
  if (this->lockedXmmRegA == reg) {
    __assert_fail("reg != lockedXmmRegA",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x28b,"void CodeGenGenericContext::LockXmmReg(x86XmmReg)");
  }
  if (this->lockedXmmRegB != reg) {
    if (this->lockedXmmRegA == rXmmRegCount) {
      this->lockedXmmRegA = reg;
    }
    else {
      if (this->lockedXmmRegB != rXmmRegCount) {
        __assert_fail("!\"too many register locks\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x293,"void CodeGenGenericContext::LockXmmReg(x86XmmReg)");
      }
      this->lockedXmmRegB = reg;
    }
    return;
  }
  __assert_fail("reg != lockedXmmRegB",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                ,0x28c,"void CodeGenGenericContext::LockXmmReg(x86XmmReg)");
}

Assistant:

void CodeGenGenericContext::LockXmmReg(x86XmmReg reg)
{
	assert(reg != lockedXmmRegA);
	assert(reg != lockedXmmRegB);

	if(lockedXmmRegA == rXmmRegCount)
		lockedXmmRegA = reg;
	else if(lockedXmmRegB == rXmmRegCount)
		lockedXmmRegB = reg;
	else
		assert(!"too many register locks");
}